

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O0

void __thiscall front::syntax::SyntaxAnalyze::gm_return_stmt(SyntaxAnalyze *this)

{
  undefined1 uVar1;
  element_type *peVar2;
  long in_RDI;
  RightVal *unaff_retaddr;
  LeftVal *in_stack_00000008;
  undefined4 in_stack_00000010;
  JumpKind in_stack_00000014;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_00000018;
  LabelId in_stack_00000024;
  LabelId in_stack_00000028;
  JumpInstructionKind in_stack_0000002c;
  SyntaxAnalyze *in_stack_00000030;
  TyKind in_stack_00000044;
  SyntaxAnalyze *in_stack_00000048;
  RightVal right;
  string tmpName;
  SharedExNdPtr retValue;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> retStr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__u;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_80 [128];
  
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x2ad489);
  match_one_word(in_stack_00000030,in_stack_0000002c);
  uVar1 = try_word((SyntaxAnalyze *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                   (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),(Token)in_stack_fffffffffffffec8)
  ;
  if (!(bool)uVar1) {
    std::shared_ptr<front::express::ExpressNode>::shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2ad4cf);
    gm_exp(in_stack_00000048);
    std::shared_ptr<front::express::ExpressNode>::operator=
              ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffec0,
               (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffeb8);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2ad505);
    peVar2 = std::
             __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2ad512);
    if (peVar2->_type == CNS) {
      irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
                ((irGenerator *)in_stack_00000048,in_stack_00000044);
      __u = &local_a8;
      std::
      variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x2ad547);
      std::
      __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2ad554);
      std::variant<int,int,std::__cxx11::string>::emplace<0ul,int&>
                ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffec0,(int *)in_stack_fffffffffffffeb8);
      in_stack_fffffffffffffec0 =
           (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(in_RDI + 0x80);
      std::variant<int,std::__cxx11::string>::
      variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      std::
      variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffffec0,
                (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffffeb8);
      irGenerator::irGenerator::ir_assign
                ((irGenerator *)CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_00000008,
                 unaff_retaddr);
      std::
      variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x2ad5bd);
      std::
      variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x2ad5c7);
      std::optional<std::__cxx11::string>::operator=
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)CONCAT17(uVar1,in_stack_fffffffffffffed0),__u);
      std::
      variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x2ad5eb);
      std::__cxx11::string::~string(local_80);
    }
    else {
      std::
      __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2ad6ac);
      std::optional<std::__cxx11::string>::operator=
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)CONCAT17(uVar1,in_stack_fffffffffffffed0),in_stack_fffffffffffffec8);
    }
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2ad6d1);
  }
  match_one_word(in_stack_00000030,in_stack_0000002c);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(in_stack_fffffffffffffec0,
           (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(in_RDI + 0x80));
  irGenerator::irGenerator::ir_jump
            ((irGenerator *)in_stack_00000030,in_stack_0000002c,in_stack_00000028,in_stack_00000024,
             in_stack_00000018,in_stack_00000014);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x2ad740);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x2ad74d);
  return;
}

Assistant:

void SyntaxAnalyze::gm_return_stmt() {
  std::optional<string> retStr;

  match_one_word(Token::RETURNTK);
  if (!try_word(1, Token::SEMICN)) {
    SharedExNdPtr retValue;

    retValue = gm_exp();

    if (retValue->_type == NodeType::CNS) {
      string tmpName = irGenerator.getNewTmpValueName(TyKind::Int);
      RightVal right;
      right.emplace<0>(retValue->_value);
      irGenerator.ir_assign(tmpName, right);
      retStr = tmpName;
    } else {
      retStr = retValue->_name;
    }
  }
  match_one_word(Token::SEMICN);

  irGenerator.ir_jump(mir::inst::JumpInstructionKind::Return, -1, -1, retStr,
                      mir::inst::JumpKind::Undefined);
}